

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t add_pattern_from_file
                  (archive_match *a,match_list *mlist,wchar_t mbs,void *pathname,
                  wchar_t nullSeparator)

{
  char cVar1;
  void *_p;
  wchar_t wVar2;
  archive *_a;
  ulong n;
  size_t size;
  void *buff;
  int64_t offset;
  archive_entry *ae;
  size_t local_70;
  archive_string local_68;
  match_list *local_50;
  void *local_48;
  int64_t local_40;
  archive_entry *local_38;
  
  local_50 = mlist;
  _a = archive_read_new();
  if (_a == (archive *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    return L'\xffffffe2';
  }
  archive_read_support_format_raw(_a);
  wVar2 = archive_read_support_format_empty(_a);
  if (wVar2 == L'\0') {
    if (mbs == L'\0') {
      wVar2 = archive_read_open_filename_w(_a,(wchar_t *)pathname,0x2800);
    }
    else {
      wVar2 = archive_read_open_filename(_a,(char *)pathname,0x2800);
    }
    if (wVar2 == L'\0') {
      wVar2 = archive_read_next_header(_a,&local_38);
      if (wVar2 != L'\0') {
        archive_read_free(_a);
        if (wVar2 == L'\x01') {
          return L'\0';
        }
        archive_copy_error(&a->archive,_a);
        return wVar2;
      }
      local_68.s = (char *)0x0;
      local_68.length = 0;
      local_68.buffer_length = 0;
LAB_001a4789:
      wVar2 = archive_read_data_block(_a,&local_48,&local_70,&local_40);
      _p = local_48;
      if (wVar2 != L'\0') {
        if (wVar2 < L'\0') {
          archive_copy_error(&a->archive,_a);
        }
        else if (((wVar2 != L'\x01') || (local_68.length == 0)) ||
                (wVar2 = add_pattern_mbs(a,local_50,local_68.s), wVar2 == L'\0')) {
          archive_read_free(_a);
          archive_string_free(&local_68);
          return L'\0';
        }
LAB_001a48a0:
        archive_read_free(_a);
        archive_string_free(&local_68);
        return wVar2;
      }
joined_r0x001a479e:
      if (local_70 != 0) {
        n = 0;
        do {
          cVar1 = *(char *)((long)_p + n);
          if (nullSeparator == L'\0') {
            if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_001a47d0;
          }
          else if (cVar1 == '\0') goto LAB_001a47d0;
          n = n + 1;
          if (local_70 == n) {
            archive_strncat(&local_68,_p,local_70);
            break;
          }
        } while( true );
      }
      goto LAB_001a4789;
    }
  }
  archive_copy_error(&a->archive,_a);
  archive_read_free(_a);
  return wVar2;
LAB_001a47d0:
  local_70 = ~n + local_70;
  archive_strncat(&local_68,_p,n);
  if (local_68.length != 0) {
    wVar2 = add_pattern_mbs(a,local_50,local_68.s);
    if (wVar2 != L'\0') goto LAB_001a48a0;
    local_68.length = 0;
  }
  _p = (void *)((long)_p + n + 1);
  goto joined_r0x001a479e;
}

Assistant:

static int
add_pattern_from_file(struct archive_match *a, struct match_list *mlist,
    int mbs, const void *pathname, int nullSeparator)
{
	struct archive *ar;
	struct archive_entry *ae;
	struct archive_string as;
	const void *buff;
	size_t size;
	int64_t offset;
	int r;

	ar = archive_read_new(); 
	if (ar == NULL) {
		archive_set_error(&(a->archive), ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	r = archive_read_support_format_raw(ar);
	r = archive_read_support_format_empty(ar);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	if (mbs)
		r = archive_read_open_filename(ar, pathname, 512*20);
	else
		r = archive_read_open_filename_w(ar, pathname, 512*20);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	r = archive_read_next_header(ar, &ae);
	if (r != ARCHIVE_OK) {
		archive_read_free(ar);
		if (r == ARCHIVE_EOF) {
			return (ARCHIVE_OK);
		} else {
			archive_copy_error(&(a->archive), ar);
			return (r);
		}
	}

	archive_string_init(&as);

	while ((r = archive_read_data_block(ar, &buff, &size, &offset))
	    == ARCHIVE_OK) {
		const char *b = (const char *)buff;

		while (size) {
			const char *s = (const char *)b;
			size_t length = 0;
			int found_separator = 0;

			while (length < size) {
				if (nullSeparator) {
					if (*b == '\0') {
						found_separator = 1;
						break;
					}
				} else {
			            	if (*b == 0x0d || *b == 0x0a) {
						found_separator = 1;
						break;
					}
				}
				b++;
				length++;
			}
			if (!found_separator) {
				archive_strncat(&as, s, length);
				/* Read next data block. */
				break;
			}
			b++;
			size -= length + 1;
			archive_strncat(&as, s, length);

			/* If the line is not empty, add the pattern. */
			if (archive_strlen(&as) > 0) {
				/* Add pattern. */
				r = add_pattern_mbs(a, mlist, as.s);
				if (r != ARCHIVE_OK) {
					archive_read_free(ar);
					archive_string_free(&as);
					return (r);
				}
				archive_string_empty(&as);
			}
		}
	}

	/* If something error happend, report it immediately. */ 
	if (r < ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		archive_string_free(&as);
		return (r);
	}

	/* If the line is not empty, add the pattern. */
	if (r == ARCHIVE_EOF && archive_strlen(&as) > 0) {
		/* Add pattern. */
		r = add_pattern_mbs(a, mlist, as.s);
		if (r != ARCHIVE_OK) {
			archive_read_free(ar);
			archive_string_free(&as);
			return (r);
		}
	}
	archive_read_free(ar);
	archive_string_free(&as);
	return (ARCHIVE_OK);
}